

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ushort uVar1;
  ValueHolder VVar2;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ArrayIndex AVar3;
  ArrayIndex index;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  pVar4;
  ValueHolder local_60;
  ushort local_58;
  Value local_48;
  
  if (this->field_0x8 == '\0') {
    Value(&local_48,arrayValue);
    Value((Value *)&local_60,&local_48);
    uVar1 = *(ushort *)&this->field_0x8;
    VVar2 = this->value_;
    this->value_ = local_60;
    *(ushort *)&this->field_0x8 = local_58 & 0x1ff | uVar1 & 0xfe00;
    local_58 = uVar1 & 0x1ff | local_58 & 0xfe00;
    local_60 = VVar2;
    ~Value((Value *)&local_60);
    ~Value(&local_48);
  }
  else if (this->field_0x8 != '\x06') {
    __assert_fail("type_ == nullValue || type_ == arrayValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x41b,"void Json::Value::resize(ArrayIndex)");
  }
  AVar3 = size(this);
  if (newSize == 0) {
    clear(this);
  }
  else if (AVar3 < newSize) {
    operator[](this,newSize - 1);
  }
  else {
    if (newSize < AVar3) {
      index = newSize;
      do {
        this_00 = &((this->value_).map_)->_M_t;
        CZString::CZString((CZString *)&local_60,index);
        pVar4 = std::
                _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                ::equal_range(this_00,(key_type *)&local_60);
        std::
        _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::_M_erase_aux(this_00,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
        CZString::~CZString((CZString *)&local_60);
        index = index + 1;
      } while (AVar3 != index);
    }
    AVar3 = size(this);
    if (AVar3 != newSize) {
      __assert_fail("size() == newSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                    ,0x42a,"void Json::Value::resize(ArrayIndex)");
    }
  }
  return;
}

Assistant:

void 
Value::resize( ArrayIndex newSize )
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == arrayValue );
   if ( type_ == nullValue )
      *this = Value( arrayValue );
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   ArrayIndex oldSize = size();
   if ( newSize == 0 )
      clear();
   else if ( newSize > oldSize )
      (*this)[ newSize - 1 ];
   else
   {
      for ( ArrayIndex index = newSize; index < oldSize; ++index )
      {
         value_.map_->erase( index );
      }
      assert( size() == newSize );
   }
#else
   value_.array_->resize( newSize );
#endif
}